

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O3

void __thiscall sznet::Logger::Impl::formatTime(Impl *this)

{
  char *__dest;
  long n;
  int iVar1;
  int64_t iVar2;
  char **ppcVar3;
  ulong uVar4;
  long *in_FS_OFFSET;
  undefined1 local_80 [8];
  Fmt us;
  T local_48;
  T local_38;
  
  iVar2 = Timestamp::microSecondsSinceEpoch(&this->m_time);
  n = iVar2 / 1000000;
  if (n != in_FS_OFFSET[-0x48]) {
    in_FS_OFFSET[-0x48] = n;
    sz_localtime((tm *)local_80,n);
    iVar1 = snprintf((char *)(*in_FS_OFFSET + -0x280),0x40,"%4d%02d%02d %02d:%02d:%02d",
                     (ulong)(us.m_buf._12_4_ + 0x76c),(ulong)(us.m_buf._8_4_ + 1),
                     (ulong)(uint)us.m_buf._4_4_,(ulong)(uint)us.m_buf._0_4_,
                     (ulong)(uint)local_80._4_4_,(ulong)(uint)local_80._0_4_);
    if (iVar1 != 0x11) {
      __assert_fail("len == 17",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/log/Logging.cpp"
                    ,0x89,"void sznet::Logger::Impl::formatTime()");
    }
  }
  Fmt::Fmt<int>((Fmt *)local_80,".%06d ",(int)iVar2 + (int)n * -1000000);
  if (us.m_buf._24_4_ == 8) {
    T::T(&local_48,(char *)(*in_FS_OFFSET + -0x280),0x11);
    __dest = (this->m_stream).m_buffer.m_cur;
    uVar4 = (ulong)(int)local_48.m_len;
    ppcVar3 = &(this->m_stream).m_buffer.m_cur;
    if (uVar4 < (ulong)(long)((int)ppcVar3 - (int)__dest)) {
      memcpy(__dest,local_48.m_str,uVar4);
      *ppcVar3 = *ppcVar3 + uVar4;
    }
    T::T(&local_38,local_80,8);
    uVar4 = (ulong)(int)local_38.m_len;
    if (uVar4 < (ulong)(long)((int)ppcVar3 - (int)*ppcVar3)) {
      memcpy(*ppcVar3,local_38.m_str,uVar4);
      *ppcVar3 = *ppcVar3 + uVar4;
    }
    return;
  }
  __assert_fail("us.length() == 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/log/Logging.cpp"
                ,0x8d,"void sznet::Logger::Impl::formatTime()");
}

Assistant:

void Logger::Impl::formatTime()
{
	int64_t microSecondsSinceEpoch = m_time.microSecondsSinceEpoch();
	time_t seconds = static_cast<time_t>(microSecondsSinceEpoch / Timestamp::kMicroSecondsPerSecond);
	int microSeconds = static_cast<int>(microSecondsSinceEpoch % Timestamp::kMicroSecondsPerSecond);
	if (seconds != t_lastSecond)
	{
		t_lastSecond = seconds;
		struct tm tm_time;
		sz_localtime(tm_time, seconds);
		int len = snprintf(t_time, sizeof(t_time), "%4d%02d%02d %02d:%02d:%02d",
			tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
			tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec);
		assert(len == 17);
		(void)len;
	}
	Fmt us(".%06d ", microSeconds);
	assert(us.length() == 8);
	m_stream << T(t_time, 17) << T(us.data(), 8);
}